

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color_maps.cpp
# Opt level: O3

bool polyscope::render::buildColormapSelector(string *cm,string *fieldName)

{
  long *plVar1;
  char *label;
  size_t __n;
  bool bVar2;
  int iVar3;
  ImVec2 in_RAX;
  bool bVar4;
  unique_ptr<polyscope::render::ValueColorMap,_std::default_delete<polyscope::render::ValueColorMap>_>
  *c;
  long *plVar5;
  ImVec2 local_38;
  
  local_38 = in_RAX;
  ImGui::PushItemWidth(100.0);
  bVar4 = false;
  bVar2 = ImGui::BeginCombo((fieldName->_M_dataplus)._M_p,(cm->_M_dataplus)._M_p,0);
  if (bVar2) {
    bVar4 = false;
    plVar1 = *(long **)(engine + 0x210);
    for (plVar5 = *(long **)(engine + 0x208); plVar5 != plVar1; plVar5 = plVar5 + 1) {
      label = *(char **)*plVar5;
      __n = ((undefined8 *)*plVar5)[1];
      if (__n == cm->_M_string_length) {
        if (__n == 0) {
          bVar2 = true;
        }
        else {
          iVar3 = bcmp(label,(cm->_M_dataplus)._M_p,__n);
          bVar2 = iVar3 == 0;
        }
      }
      else {
        bVar2 = false;
      }
      local_38.x = 0.0;
      local_38.y = 0.0;
      bVar2 = ImGui::Selectable(label,bVar2,0,&local_38);
      if (bVar2) {
        std::__cxx11::string::_M_assign((string *)cm);
        bVar4 = true;
      }
    }
    ImGui::EndCombo();
  }
  ImGui::PopItemWidth();
  return bVar4;
}

Assistant:

bool buildColormapSelector(std::string& cm, std::string fieldName) {
  bool changed = false;

  ImGui::PushItemWidth(100);

  if (ImGui::BeginCombo(fieldName.c_str(), cm.c_str())) {
    for (auto& c : render::engine->colorMaps) {
      if (ImGui::Selectable(c->name.c_str(), c->name == cm)) {
        changed = true;
        cm = c->name;
      }
    }
    ImGui::EndCombo();
  }

  ImGui::PopItemWidth();

  return changed;
}